

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::softmax(Model *this,int32_t target,real lr)

{
  float fVar1;
  undefined1 auVar2 [16];
  ulong i;
  undefined1 auVar3 [16];
  
  Vector::zero(&this->grad_);
  computeOutputSoftmax(this);
  for (i = 0; (long)i < (long)this->osz_; i = i + 1) {
    fVar1 = ((float)((uint)((uint)target == i) * 0x3f800000) -
            (this->output_).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[i]) * lr;
    Vector::addRow(&this->grad_,
                   (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,i,fVar1);
    Matrix::addRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&this->hidden_,i,fVar1);
  }
  fVar1 = (this->output_).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[target];
  auVar3 = ZEXT816(0) << 0x40;
  if (fVar1 <= 1.0) {
    auVar3 = ZEXT416((uint)(this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)(fVar1 * 512.0)]);
  }
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar3,auVar2);
  return auVar3._0_4_;
}

Assistant:

real Model::softmax(int32_t target, real lr) {
  grad_.zero();
  computeOutputSoftmax();
  for (int32_t i = 0; i < osz_; i++) {
    real label = (i == target) ? 1.0 : 0.0;
    real alpha = lr * (label - output_[i]);
    grad_.addRow(*wo_, i, alpha);
    wo_->addRow(hidden_, i, alpha);
  }
  return -log(output_[target]);
}